

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintTwoBodies::ArchiveOUT(ChConstraintTwoBodies *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChConstraintTwoBodies>(marchive);
  ChConstraintTwo::ArchiveOUT(&this->super_ChConstraintTwo,marchive);
  return;
}

Assistant:

void ChConstraintTwoBodies::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraintTwoBodies>();

    // serialize the parent class data too
    ChConstraintTwo::ArchiveOUT(marchive);

    // serialize all member data:
    // NOTHING INTERESTING TO SERIALIZE (the Cq jacobians are not so
    // important to waste disk space.. they may be recomputed run-time,
    // and pointers to variables must be rebound in run-time.)
    // mstream << Cq_a;
    // mstream << Cq_b;
}